

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicScalableKReach.cpp
# Opt level: O1

void __thiscall
DynamicScalableKReach::DynamicPartialIndex::DynamicPartialIndex
          (DynamicPartialIndex *this,DynamicScalableKReach *parent,Graph *graph,distance_t k,
          uint32_t budget,bool isD2)

{
  this->parent_ = parent;
  this->graph_ = graph;
  this->k_ = k;
  this->budget_ = budget;
  this->isD2_ = isD2;
  (this->succ_)._M_h._M_buckets = &(this->succ_)._M_h._M_single_bucket;
  (this->succ_)._M_h._M_bucket_count = 1;
  (this->succ_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->succ_)._M_h._M_element_count = 0;
  (this->succ_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->succ_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->succ_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->pred_)._M_h._M_buckets = &(this->pred_)._M_h._M_single_bucket;
  (this->pred_)._M_h._M_bucket_count = 1;
  (this->pred_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pred_)._M_h._M_element_count = 0;
  (this->pred_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pred_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pred_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->quedeg_ = &parent->quedeg_;
  this->degree_ = &parent->degree_;
  this->queue_ = &parent->queue_;
  this->quedist_ = &parent->quedist_;
  this->updated_ = &parent->updated_;
  (this->succ_temp_)._M_h._M_buckets = &(this->succ_temp_)._M_h._M_single_bucket;
  (this->succ_temp_)._M_h._M_bucket_count = 1;
  (this->succ_temp_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->succ_temp_)._M_h._M_element_count = 0;
  (this->succ_temp_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->succ_temp_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->succ_temp_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->pred_temp_)._M_h._M_buckets = &(this->pred_temp_)._M_h._M_single_bucket;
  (this->pred_temp_)._M_h._M_bucket_count = 1;
  (this->pred_temp_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pred_temp_)._M_h._M_element_count = 0;
  (this->pred_temp_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pred_temp_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pred_temp_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

DynamicScalableKReach::DynamicPartialIndex::DynamicPartialIndex(DynamicScalableKReach &parent, const Graph &graph,
                                                                distance_t k, uint32_t budget, bool isD2)
        : parent_(parent), graph_(graph), k_(k), budget_(budget), isD2_(isD2),
          quedeg_(parent.quedeg_), degree_(parent.degree_),
          queue_(parent.queue_), quedist_(parent.quedist_), updated_(parent.updated_) {}